

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O2

void __thiscall
Diligent::SerializedPipelineStateImpl::PatchShadersGL<Diligent::RayTracingPipelineStateCreateInfo>
          (SerializedPipelineStateImpl *this,RayTracingPipelineStateCreateInfo *CreateInfo)

{
  pointer __n;
  long lVar1;
  long lVar2;
  SerializedShaderImpl *pSVar3;
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  *pvVar4;
  _Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  *this_00;
  pointer pSVar5;
  ShaderStageInfoGL *pSVar6;
  char (*in_RCX) [42];
  char *pcVar7;
  char *Args_1;
  allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL> *in_RDX;
  allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL> *extraout_RDX;
  allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL> *extraout_RDX_00;
  ulong __n_00;
  Uint32 i;
  ulong uVar8;
  size_t i_3;
  long lVar9;
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ShaderStages;
  SHADER_TYPE ActiveShaderStages;
  SerializedPipelineStateImpl *local_110;
  anon_class_32_4_a6542874 AddShader;
  unordered_set<Diligent::IShader_*,_std::hash<Diligent::IShader_*>,_std::equal_to<Diligent::IShader_*>,_std::allocator<Diligent::IShader_*>_>
  UniqueShaders;
  string local_50;
  
  ShaderStages.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ActiveShaderStages = SHADER_TYPE_UNKNOWN;
  ShaderStages.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ShaderStages.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110 = this;
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_RAY_TRACING)
  {
    FormatString<char[26],char[42]>
              ((string *)&UniqueShaders,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsRayTracingPipeline()",in_RCX);
    DebugAssertionFailed
              ((Char *)UniqueShaders._M_h._M_buckets,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x118);
    std::__cxx11::string::~string((string *)&UniqueShaders);
    in_RDX = extraout_RDX;
  }
  UniqueShaders._M_h._M_buckets = &UniqueShaders._M_h._M_single_bucket;
  UniqueShaders._M_h._M_bucket_count = 1;
  UniqueShaders._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  UniqueShaders._M_h._M_element_count = 0;
  UniqueShaders._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  UniqueShaders._M_h._M_rehash_policy._M_next_resize = 0;
  UniqueShaders._M_h._M_single_bucket = (__node_base_ptr)0x0;
  AddShader.UniqueShaders = &UniqueShaders;
  AddShader.ActiveShaderStages = &ActiveShaderStages;
  AddShader.WaitUntilShadersReady = true;
  if (ShaderStages.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      ShaderStages.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ShaderStages.
    super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         ShaderStages.
         super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  lVar9 = (long)ShaderStages.
                super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)ShaderStages.
                super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                ._M_impl.super__Vector_impl_data._M_start;
  pcVar7 = (char *)(lVar9 >> 4);
  if (pcVar7 < (char (*) [22])0x6) {
    uVar8 = 6 - (long)pcVar7;
    if ((ulong)((long)ShaderStages.
                      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                (long)ShaderStages.
                      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                      ._M_impl.super__Vector_impl_data._M_finish >> 4) < uVar8) {
      __n_00 = uVar8;
      AddShader.ShaderStages = &ShaderStages;
      this_00 = (_Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                 *)std::
                   vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                   ::_M_check_len(&ShaderStages,uVar8,"vector::_M_default_append");
      pSVar5 = std::
               _Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
               ::_M_allocate(this_00,__n_00);
      std::
      __uninitialized_default_n_a<Diligent::(anonymous_namespace)::ShaderStageInfoGL*,unsigned_long,Diligent::(anonymous_namespace)::ShaderStageInfoGL>
                ((ShaderStageInfoGL *)(lVar9 + (long)pSVar5),uVar8,extraout_RDX_00);
      for (pcVar7 = (char *)0x0;
          __n = (pointer)(pcVar7 + (long)&(ShaderStages.
                                           super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->Type),
          __n != ShaderStages.
                 super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                 ._M_impl.super__Vector_impl_data._M_finish; pcVar7 = pcVar7 + 0x10) {
        pSVar3 = __n->pShader;
        *(undefined8 *)(pcVar7 + (long)pSVar5) = *(undefined8 *)__n;
        *(SerializedShaderImpl **)((long)(pcVar7 + (long)pSVar5) + 8) = pSVar3;
      }
      std::
      _Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ::_M_deallocate((_Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                       *)ShaderStages.
                         super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                      (pointer)((long)ShaderStages.
                                      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ShaderStages.
                                      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4),(size_t)__n);
      ShaderStages.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar5 + (long)this_00;
      ShaderStages.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_start = pSVar5;
      ShaderStages.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((long)&((ShaderStageInfoGL *)(lVar9 + (long)pSVar5))->Type +
                    (ulong)(uint)((int)uVar8 << 4));
      goto LAB_001eaf1f;
    }
    AddShader.ShaderStages = &ShaderStages;
    pSVar6 = std::
             __uninitialized_default_n_a<Diligent::(anonymous_namespace)::ShaderStageInfoGL*,unsigned_long,Diligent::(anonymous_namespace)::ShaderStageInfoGL>
                       (ShaderStages.
                        super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                        ._M_impl.super__Vector_impl_data._M_finish,uVar8,in_RDX);
    pvVar4 = AddShader.ShaderStages;
  }
  else {
    AddShader.ShaderStages = &ShaderStages;
    if ((lVar9 == 0x60) ||
       (pSVar6 = ShaderStages.
                 super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                 ._M_impl.super__Vector_impl_data._M_start + 6,
       AddShader.ShaderStages = &ShaderStages, pvVar4 = &ShaderStages,
       ShaderStages.
       super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
       ._M_impl.super__Vector_impl_data._M_finish == pSVar6)) goto LAB_001eaf1f;
  }
  AddShader.ShaderStages = pvVar4;
  ShaderStages.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar6;
LAB_001eaf1f:
  ActiveShaderStages = SHADER_TYPE_UNKNOWN;
  lVar9 = 8;
  for (uVar8 = 0; uVar8 < CreateInfo->GeneralShaderCount; uVar8 = uVar8 + 1) {
    PipelineStateUtils::
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>_>
    ::anon_class_32_4_a6542874::operator()
              (&AddShader,*(IShader **)((long)&CreateInfo->pGeneralShaders->Name + lVar9));
    lVar9 = lVar9 + 0x10;
  }
  lVar9 = 0;
  for (uVar8 = 0; uVar8 < CreateInfo->TriangleHitShaderCount; uVar8 = uVar8 + 1) {
    PipelineStateUtils::
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>_>
    ::anon_class_32_4_a6542874::operator()
              (&AddShader,
               *(IShader **)((long)&CreateInfo->pTriangleHitShaders->pClosestHitShader + lVar9));
    PipelineStateUtils::
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>_>
    ::anon_class_32_4_a6542874::operator()
              (&AddShader,
               *(IShader **)((long)&CreateInfo->pTriangleHitShaders->pAnyHitShader + lVar9));
    lVar9 = lVar9 + 0x18;
  }
  lVar9 = 0;
  for (uVar8 = 0; uVar8 < CreateInfo->ProceduralHitShaderCount; uVar8 = uVar8 + 1) {
    PipelineStateUtils::
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>_>
    ::anon_class_32_4_a6542874::operator()
              (&AddShader,
               *(IShader **)((long)&CreateInfo->pProceduralHitShaders->pIntersectionShader + lVar9))
    ;
    PipelineStateUtils::
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>_>
    ::anon_class_32_4_a6542874::operator()
              (&AddShader,
               *(IShader **)((long)&CreateInfo->pProceduralHitShaders->pClosestHitShader + lVar9));
    PipelineStateUtils::
    ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>_>
    ::anon_class_32_4_a6542874::operator()
              (&AddShader,
               *(IShader **)((long)&CreateInfo->pProceduralHitShaders->pAnyHitShader + lVar9));
    lVar9 = lVar9 + 0x20;
  }
  GetShaderTypePipelineIndex(SHADER_TYPE_RAY_GEN,PIPELINE_TYPE_RAY_TRACING);
  if (ShaderStages.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      ShaderStages.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[22]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!ShaderStages.empty()",(char (*) [22])pcVar7);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x151);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::
  _Hashtable<Diligent::IShader_*,_Diligent::IShader_*,_std::allocator<Diligent::IShader_*>,_std::__detail::_Identity,_std::equal_to<Diligent::IShader_*>,_std::hash<Diligent::IShader_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&UniqueShaders._M_h);
  if ((local_110->m_Data).Shaders._M_elems[0].
      super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (local_110->m_Data).Shaders._M_elems[0].
      super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[64]>
              ((string *)&UniqueShaders,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].empty()",
               (char (*) [64])local_110);
    DebugAssertionFailed
              ((Char *)UniqueShaders._M_h._M_buckets,"PatchShadersGL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_GL.cpp"
               ,0x222);
    std::__cxx11::string::~string((string *)&UniqueShaders);
  }
  lVar9 = 8;
  for (pcVar7 = (char *)0x0;
      Args_1 = (char *)((long)ShaderStages.
                              super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)ShaderStages.
                              super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4), pcVar7 < Args_1;
      pcVar7 = pcVar7 + 1) {
    lVar1 = *(long *)((long)&(ShaderStages.
                              super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                              ._M_impl.super__Vector_impl_data._M_start)->Type + lVar9);
    lVar2 = *(long *)(lVar1 + 200);
    UniqueShaders._M_h._M_bucket_count = *(size_type *)(lVar1 + 0x20);
    UniqueShaders._M_h._M_before_begin._M_nxt = *(_Hash_node_base **)(lVar2 + 0xf0);
    UniqueShaders._M_h._M_rehash_policy._M_next_resize = *(undefined8 *)(lVar1 + 0x40);
    if (*(char *)(lVar2 + 0x118) != '\0') {
      UniqueShaders._M_h._M_rehash_policy._M_next_resize = 0x731172;
    }
    UniqueShaders._M_h._M_rehash_policy._0_8_ = *(undefined8 *)(lVar2 + 0xf8);
    UniqueShaders._M_h._M_buckets = (__buckets_ptr)0x0;
    UniqueShaders._M_h._M_element_count = 0;
    UniqueShaders._M_h._M_single_bucket = (__node_base_ptr)0x0;
    SerializeShaderCreateInfo(local_110,OpenGL,(ShaderCreateInfo *)&UniqueShaders);
    lVar9 = lVar9 + 0x10;
  }
  if ((char *)(((long)(local_110->m_Data).Shaders._M_elems[0].
                      super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_110->m_Data).Shaders._M_elems[0].
                     super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x30) != Args_1) {
    FormatString<char[26],char[86]>
              ((string *)&UniqueShaders,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].size() == ShaderStages.size()"
               ,(char (*) [86])Args_1);
    DebugAssertionFailed
              ((Char *)UniqueShaders._M_h._M_buckets,"PatchShadersGL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_GL.cpp"
               ,0x22c);
    std::__cxx11::string::~string((string *)&UniqueShaders);
  }
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ::~vector(&ShaderStages);
  return;
}

Assistant:

void SerializedPipelineStateImpl::PatchShadersGL(const CreateInfoType& CreateInfo) noexcept(false)
{
    std::vector<ShaderStageInfoGL> ShaderStages;
    SHADER_TYPE                    ActiveShaderStages    = SHADER_TYPE_UNKNOWN;
    constexpr bool                 WaitUntilShadersReady = true;
    PipelineStateUtils::ExtractShaders<SerializedShaderImpl>(CreateInfo, ShaderStages, WaitUntilShadersReady, ActiveShaderStages);

    VERIFY_EXPR(m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].empty());
    for (size_t i = 0; i < ShaderStages.size(); ++i)
    {
        const auto& Stage             = ShaderStages[i];
        const auto& CI                = Stage.pShader->GetCreateInfo();
        const auto* pCompiledShaderGL = Stage.pShader->GetShader<CompiledShaderGL>(DeviceObjectArchive::DeviceType::OpenGL);
        const auto  SerCI             = pCompiledShaderGL->GetSerializationCI(CI);

        SerializeShaderCreateInfo(DeviceType::OpenGL, SerCI);
    }
    VERIFY_EXPR(m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].size() == ShaderStages.size());
}